

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

int INT_EVfreeze_stone(CManager_conflict cm,EVstone stone_id)

{
  stone_type p_Var1;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffd8;
  int local_4;
  
  p_Var1 = stone_struct(in_stack_ffffffffffffffd8,0);
  if (p_Var1 == (stone_type)0x0) {
    local_4 = -1;
  }
  else {
    p_Var1->is_frozen = 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

extern int
INT_EVfreeze_stone(CManager cm, EVstone stone_id)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    stone = stone_struct(evp, stone_id);
    if (!stone) return -1;
    stone->is_frozen = 1;
    return 1;	
}